

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TextFlow::Column::const_iterator::calcLength(const_iterator *this)

{
  ulong uVar1;
  byte bVar2;
  Column *pCVar3;
  size_t sVar4;
  pointer pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  
  this->m_addHyphen = false;
  pCVar3 = this->m_column;
  sVar4 = this->m_lineStart;
  this->m_parsedTo = sVar4;
  pcVar5 = (pCVar3->m_string)._M_dataplus._M_p;
  sVar11 = sVar4;
  if (pcVar5[sVar4] == '\n') {
    sVar11 = sVar4 + 1;
    this->m_parsedTo = sVar11;
  }
  sVar10 = pCVar3->m_width;
  sVar7 = indentSize(this);
  sVar10 = sVar10 - sVar7;
  uVar6 = (pCVar3->m_string)._M_string_length;
  uVar1 = sVar4 + sVar10;
  uVar8 = uVar6;
  if (uVar1 < uVar6) {
    uVar8 = uVar1;
  }
  while ((sVar11 < uVar8 && (pcVar5[sVar11] != '\n'))) {
    sVar11 = sVar11 + 1;
    this->m_parsedTo = sVar11;
  }
  if (sVar11 < uVar1) {
    sVar11 = sVar11 - sVar4;
LAB_00159a53:
    this->m_lineLength = sVar11;
    return;
  }
  sVar11 = sVar10;
  while (sVar11 != 0) {
    if (-sVar11 == sVar4) {
      __assert_fail("at > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                    ,0x1ac1,"bool (anonymous namespace)::isBoundary(const std::string &, size_t)");
    }
    if (uVar6 < uVar1) {
      __assert_fail("at <= line.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                    ,0x1ac2,"bool (anonymous namespace)::isBoundary(const std::string &, size_t)");
    }
    sVar7 = uVar6 - sVar4;
    if (uVar6 - sVar4 == sVar11) goto LAB_00159a2a;
    bVar2 = pcVar5[sVar11 + sVar4];
    sVar7 = sVar11;
    if (((((ulong)bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) &&
        ((0x20 < (ulong)(byte)pcVar5[sVar11 + (sVar4 - 1)] ||
         ((0x100002600U >> ((ulong)(byte)pcVar5[sVar11 + (sVar4 - 1)] & 0x3f) & 1) == 0)))) ||
       ((pvVar9 = memchr("[({<|",(int)(char)bVar2,5), pvVar9 != (void *)0x0 ||
        (pvVar9 = memchr(::(anonymous_namespace)::isBreakableAfter(char)::chars,
                         (int)pcVar5[sVar11 + (sVar4 - 1)],0xf), sVar11 = sVar11 - 1,
        pvVar9 != (void *)0x0)))) goto LAB_00159a2a;
  }
  sVar7 = 0;
LAB_00159a2a:
  do {
    sVar11 = sVar7;
    if (sVar11 == 0) {
      this->m_addHyphen = true;
      sVar11 = sVar10 - 1;
      goto LAB_00159a53;
    }
    if ((0x20 < (ulong)(byte)pcVar5[sVar11 + (sVar4 - 1)]) ||
       (sVar7 = sVar11 - 1,
       (0x100002600U >> ((ulong)(byte)pcVar5[sVar11 + (sVar4 - 1)] & 0x3f) & 1) == 0))
    goto LAB_00159a53;
  } while( true );
}

Assistant:

void Column::const_iterator::calcLength() {
            m_addHyphen = false;
            m_parsedTo = m_lineStart;

            std::string const& current_line = m_column.m_string;
            if ( current_line[m_lineStart] == '\n' ) {
                ++m_parsedTo;
            }

            const auto maxLineLength = m_column.m_width - indentSize();
            const auto maxParseTo = std::min(current_line.size(), m_lineStart + maxLineLength);
            while ( m_parsedTo < maxParseTo &&
                    current_line[m_parsedTo] != '\n' ) {
                ++m_parsedTo;
            }

            // If we encountered a newline before the column is filled,
            // then we linebreak at the newline and consider this line
            // finished.
            if ( m_parsedTo < m_lineStart + maxLineLength ) {
                m_lineLength = m_parsedTo - m_lineStart;
            } else {
                // Look for a natural linebreak boundary in the column
                // (We look from the end, so that the first found boundary is
                // the right one)
                size_t newLineLength = maxLineLength;
                while ( newLineLength > 0 && !isBoundary( current_line, m_lineStart + newLineLength ) ) {
                    --newLineLength;
                }
                while ( newLineLength > 0 &&
                        isWhitespace( current_line[m_lineStart + newLineLength - 1] ) ) {
                    --newLineLength;
                }

                // If we found one, then that is where we linebreak
                if ( newLineLength > 0 ) {
                    m_lineLength = newLineLength;
                } else {
                    // Otherwise we have to split text with a hyphen
                    m_addHyphen = true;
                    m_lineLength = maxLineLength - 1;
                }
            }
        }